

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

int __thiscall
MODEL3D::three_dim_model::generate_model
          (three_dim_model *this,string *gds_path,string *pif_path,string *py_path,string *cont_path
          ,bool *multi_flag)

{
  bool bVar1;
  int iVar2;
  iterator __x;
  reference pbVar3;
  ostream *poVar4;
  pointer ppVar5;
  string local_280;
  _Base_ptr local_260;
  uint local_254;
  _Self local_250;
  uint local_244;
  _Self local_240;
  _Self local_238;
  iterator layer;
  size_t total_layers;
  iterator iStack_220;
  int layer_count;
  iterator layer_end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  is_any_ofF<char> local_1e8;
  undefined1 local_1d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_string_vector;
  undefined1 local_1a8 [8];
  section_data section_polygon_only;
  gdscpp gds_file;
  bool *multi_flag_local;
  string *cont_path_local;
  string *py_path_local;
  string *pif_path_local;
  string *gds_path_local;
  three_dim_model *this_local;
  
  gdscpp::gdscpp((gdscpp *)&section_polygon_only.axis_type);
  section_data::section_data((section_data *)local_1a8);
  this->enable_multiprocessing = (bool)(*multi_flag & 1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d0);
  boost::algorithm::is_any_of<char[4]>(&local_1e8,(char (*) [4])"./\\");
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1d0,py_path,&local_1e8,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_1e8);
  __x = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0);
  local_1f0 = std::
              prev<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (__x._M_current,2);
  pbVar3 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_1f0);
  std::__cxx11::string::operator=((string *)&this->cell_name,(string *)pbVar3);
  std::__cxx11::string::string((string *)&layer_end,(string *)gds_path);
  iVar2 = gdscpp::import((gdscpp *)&section_polygon_only.axis_type,(string *)&layer_end);
  std::__cxx11::string::~string((string *)&layer_end);
  if (iVar2 == 0) {
    import_process_info(this,pif_path);
    iVar2 = load_etch_contour_map(this,cont_path);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Beginning GDS expansion process...");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      iVar2 = section_data::extract_all_polygons
                        ((section_data *)local_1a8,(gdscpp *)&section_polygon_only.axis_type,
                         &this->polygons_map);
      if (iVar2 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"GDS expansion completed.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      calculate_all_layer_bounds(this);
      poVar4 = std::operator<<((ostream *)&std::cout,"Converting polygons to clipper format...");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      synchronize_clipper_polygons_map(this);
      poVar4 = std::operator<<((ostream *)&std::cout,"Polygon map ready.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "# ------------------------- Generating 3D Layers ------------------------- #"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      iStack_220 = std::
                   map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                   ::end(&this->polygons_map);
      total_layers._4_4_ = 0;
      layer._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::size(&this->polygons_map);
      initialize_python_script(this);
      local_238._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::begin(&this->polygons_map);
      while (bVar1 = std::operator!=(&local_238,&stack0xfffffffffffffde0), bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Generating Layer ");
        total_layers._4_4_ = total_layers._4_4_ + 1;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,total_layers._4_4_);
        poVar4 = std::operator<<(poVar4,"/");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)layer._M_node);
        std::operator<<(poVar4,"\t---> ");
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                 ::operator->(&local_238);
        local_244 = ppVar5->first;
        local_240._M_node =
             (_Base_ptr)
             std::
             map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
             ::find(&this->proc_info_map,(key_type *)&local_244);
        local_250._M_node =
             (_Base_ptr)
             std::
             map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
             ::end(&this->proc_info_map);
        bVar1 = std::operator!=(&local_240,&local_250);
        if (bVar1) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->(&local_238);
          local_254 = ppVar5->first;
          generate_layer(this,(int *)&local_254);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_260 = (_Base_ptr)
                    std::
                    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                    ::operator++(&local_238,0);
      }
      python_script_conclude(this);
      std::__cxx11::string::string((string *)&local_280,(string *)py_path);
      python_script_write(this,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "# ----------------------- Model Generation Complete ---------------------- #"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  section_data::~section_data((section_data *)local_1a8);
  gdscpp::~gdscpp((gdscpp *)&section_polygon_only.axis_type);
  return this_local._4_4_;
}

Assistant:

int MODEL3D::three_dim_model::generate_model(
const std::string &gds_path,
const std::string &pif_path,
const std::string &py_path,
const std::string &cont_path,
const bool        &multi_flag)
{
    gdscpp gds_file;
    section_data section_polygon_only;
    enable_multiprocessing = multi_flag;
    std::vector<std::string> split_string_vector;
    boost::split(split_string_vector, py_path, boost::is_any_of("./\\"));
    cell_name = *std::prev(split_string_vector.end(),2);;
    if(gds_file.import(gds_path)==EXIT_SUCCESS)
    {
        import_process_info(pif_path);
        if(load_etch_contour_map(cont_path)==EXIT_SUCCESS)
        {
            // Populate polygon map with all GDS data
            std::cout<<"Beginning GDS expansion process..."<<std::endl;
            if(section_polygon_only.extract_all_polygons(gds_file, polygons_map)==EXIT_SUCCESS)
                std::cout<<"GDS expansion completed."<<std::endl;
            calculate_all_layer_bounds();
            // Convert map to clipper library compatible form
            std::cout<<"Converting polygons to clipper format..."<<std::endl;
            synchronize_clipper_polygons_map();
            std::cout<<"Polygon map ready."<<std::endl;
            // Generate a volume for each layer
            std::cout<< "# ------------------------- Generating 3D Layers ------------------------- #"<<std::endl;
            auto layer_end = polygons_map.end();
            int layer_count = 0;
            size_t total_layers = polygons_map.size();
            // if all layer contours are loaded
            // else state that a layer contour is missing
            // int p_cnt = 0;
            // int ln_cnt = 0;
            // int cl_cnt = 0;
            // int ps_cnt = 0;
            // int sl_cnt = 0;
            // int vl_cnt = 0;
            initialize_python_script();
            for (auto layer = polygons_map.begin(); layer != layer_end; layer++)
            {
                std::cout << "Generating Layer "
                << ++layer_count << "/" << total_layers
                << "\t---> ";
                if(proc_info_map.find(layer->first)!=proc_info_map.end())
                    generate_layer(layer->first);
                std::cout << "Done." << std::endl;
            }
            // generate_layer(60);
            python_script_conclude();
            python_script_write(py_path);
            std::cout<< "# ----------------------- Model Generation Complete ---------------------- #"<<std::endl;
            return EXIT_SUCCESS;
        }
        else
            return EXIT_FAILURE;
    }
    else
        return EXIT_FAILURE;
}